

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexst.cpp
# Opt level: O0

void __thiscall icu_63::RegexStaticSets::RegexStaticSets(RegexStaticSets *this,UErrorCode *status)

{
  UBool UVar1;
  UnicodeSet *pUVar2;
  UText *pUVar3;
  UnicodeString *pattern;
  UnicodeSet *local_580;
  UnicodeSet *local_568;
  UnicodeSet *local_558;
  UnicodeSet *local_548;
  UnicodeSet *local_538;
  UnicodeSet *local_528;
  UnicodeSet *local_518;
  UnicodeSet *local_508;
  UnicodeSet *local_4f8;
  UnicodeSet *local_4e8;
  UnicodeSet *local_4b0;
  Regex8BitSet *local_490;
  ConstChar16Ptr local_488;
  UnicodeString local_480;
  UnicodeSet local_440;
  undefined1 local_3e1;
  UnicodeSet *local_3e0;
  byte local_3d2;
  byte local_3d1;
  ConstChar16Ptr local_3d0;
  UnicodeString local_3c8;
  undefined1 local_381;
  UnicodeSet *local_380;
  byte local_372;
  byte local_371;
  ConstChar16Ptr local_370;
  UnicodeString local_368;
  undefined1 local_321;
  UnicodeSet *local_320;
  byte local_312;
  byte local_311;
  ConstChar16Ptr local_310;
  UnicodeString local_308;
  undefined1 local_2c1;
  UnicodeSet *local_2c0;
  byte local_2b2;
  byte local_2b1;
  ConstChar16Ptr local_2b0;
  UnicodeString local_2a8;
  undefined1 local_261;
  UnicodeSet *local_260;
  byte local_252;
  byte local_251;
  ConstChar16Ptr local_250;
  UnicodeString local_248;
  undefined1 local_201;
  UnicodeSet *local_200;
  byte local_1f2;
  byte local_1f1;
  ConstChar16Ptr local_1f0;
  UnicodeString local_1e8;
  undefined1 local_1a1;
  UnicodeSet *local_1a0;
  byte local_192;
  byte local_191;
  ConstChar16Ptr local_190;
  UnicodeString local_188;
  undefined1 local_141;
  UnicodeSet *local_140;
  byte local_132;
  byte local_131;
  ConstChar16Ptr local_130;
  UnicodeString local_128;
  undefined1 local_e1;
  UnicodeSet *local_e0;
  byte local_d2;
  byte local_d1;
  ConstChar16Ptr local_d0;
  UnicodeString local_c8;
  undefined1 local_81;
  UnicodeSet *local_80;
  int local_74;
  int i;
  UnicodeString local_68;
  UErrorCode *local_18;
  UErrorCode *status_local;
  RegexStaticSets *this_local;
  
  local_490 = this->fPropSets8;
  local_18 = status;
  status_local = (UErrorCode *)this;
  do {
    Regex8BitSet::Regex8BitSet(local_490);
    local_490 = local_490 + 1;
  } while (local_490 != (Regex8BitSet *)&this->field_0x208);
  local_4b0 = (UnicodeSet *)&this->field_0x208;
  do {
    UnicodeSet::UnicodeSet(local_4b0);
    local_4b0 = local_4b0 + 1;
  } while (local_4b0 != &this->fUnescapeCharSet);
  ConstChar16Ptr::ConstChar16Ptr
            ((ConstChar16Ptr *)&stack0xffffffffffffff90,(char16_t *)gUnescapeCharPattern);
  icu_63::UnicodeString::UnicodeString
            (&local_68,'\x01',(ConstChar16Ptr *)&stack0xffffffffffffff90,-1);
  pattern = &local_68;
  UnicodeSet::UnicodeSet(&this->fUnescapeCharSet,pattern,local_18);
  icu_63::UnicodeString::~UnicodeString(&local_68);
  ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)&stack0xffffffffffffff90);
  this->fRuleDigitsAlias = (UnicodeSet *)0x0;
  this->fEmptyText = (UText *)0x0;
  for (local_74 = 0; local_74 < 0xd; local_74 = local_74 + 1) {
    this->fPropSets[local_74] = (UnicodeSet *)0x0;
  }
  pUVar2 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pattern);
  local_d1 = 0;
  local_d2 = 0;
  local_4e8 = (UnicodeSet *)0x0;
  if (pUVar2 != (UnicodeSet *)0x0) {
    local_81 = 1;
    local_80 = pUVar2;
    ConstChar16Ptr::ConstChar16Ptr(&local_d0,(char16_t *)gIsWordPattern);
    local_d1 = 1;
    icu_63::UnicodeString::UnicodeString(&local_c8,'\x01',&local_d0,-1);
    local_d2 = 1;
    pattern = &local_c8;
    UnicodeSet::UnicodeSet(pUVar2,pattern,local_18);
    local_4e8 = pUVar2;
  }
  local_81 = 0;
  this->fPropSets[1] = local_4e8;
  if ((local_d2 & 1) != 0) {
    icu_63::UnicodeString::~UnicodeString(&local_c8);
  }
  if ((local_d1 & 1) != 0) {
    ConstChar16Ptr::~ConstChar16Ptr(&local_d0);
  }
  pUVar2 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pattern);
  local_131 = 0;
  local_132 = 0;
  local_4f8 = (UnicodeSet *)0x0;
  if (pUVar2 != (UnicodeSet *)0x0) {
    local_e1 = 1;
    local_e0 = pUVar2;
    ConstChar16Ptr::ConstChar16Ptr(&local_130,(char16_t *)gIsSpacePattern);
    local_131 = 1;
    icu_63::UnicodeString::UnicodeString(&local_128,'\x01',&local_130,-1);
    local_132 = 1;
    pattern = &local_128;
    UnicodeSet::UnicodeSet(pUVar2,pattern,local_18);
    local_4f8 = pUVar2;
  }
  local_e1 = 0;
  this->fPropSets[4] = local_4f8;
  if ((local_132 & 1) != 0) {
    icu_63::UnicodeString::~UnicodeString(&local_128);
  }
  if ((local_131 & 1) != 0) {
    ConstChar16Ptr::~ConstChar16Ptr(&local_130);
  }
  pUVar2 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pattern);
  local_191 = 0;
  local_192 = 0;
  local_508 = (UnicodeSet *)0x0;
  if (pUVar2 != (UnicodeSet *)0x0) {
    local_141 = 1;
    local_140 = pUVar2;
    ConstChar16Ptr::ConstChar16Ptr(&local_190,(char16_t *)gGC_ExtendPattern);
    local_191 = 1;
    icu_63::UnicodeString::UnicodeString(&local_188,'\x01',&local_190,-1);
    local_192 = 1;
    pattern = &local_188;
    UnicodeSet::UnicodeSet(pUVar2,pattern,local_18);
    local_508 = pUVar2;
  }
  local_141 = 0;
  this->fPropSets[6] = local_508;
  if ((local_192 & 1) != 0) {
    icu_63::UnicodeString::~UnicodeString(&local_188);
  }
  if ((local_191 & 1) != 0) {
    ConstChar16Ptr::~ConstChar16Ptr(&local_190);
  }
  pUVar2 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pattern);
  local_1f1 = 0;
  local_1f2 = 0;
  local_518 = (UnicodeSet *)0x0;
  if (pUVar2 != (UnicodeSet *)0x0) {
    local_1a1 = 1;
    local_1a0 = pUVar2;
    ConstChar16Ptr::ConstChar16Ptr(&local_1f0,(char16_t *)gGC_ControlPattern);
    local_1f1 = 1;
    icu_63::UnicodeString::UnicodeString(&local_1e8,'\x01',&local_1f0,-1);
    local_1f2 = 1;
    pattern = &local_1e8;
    UnicodeSet::UnicodeSet(pUVar2,pattern,local_18);
    local_518 = pUVar2;
  }
  local_1a1 = 0;
  this->fPropSets[7] = local_518;
  if ((local_1f2 & 1) != 0) {
    icu_63::UnicodeString::~UnicodeString(&local_1e8);
  }
  if ((local_1f1 & 1) != 0) {
    ConstChar16Ptr::~ConstChar16Ptr(&local_1f0);
  }
  pUVar2 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pattern);
  local_251 = 0;
  local_252 = 0;
  local_528 = (UnicodeSet *)0x0;
  if (pUVar2 != (UnicodeSet *)0x0) {
    local_201 = 1;
    local_200 = pUVar2;
    ConstChar16Ptr::ConstChar16Ptr(&local_250,(char16_t *)gGC_LPattern);
    local_251 = 1;
    icu_63::UnicodeString::UnicodeString(&local_248,'\x01',&local_250,-1);
    local_252 = 1;
    pattern = &local_248;
    UnicodeSet::UnicodeSet(pUVar2,pattern,local_18);
    local_528 = pUVar2;
  }
  local_201 = 0;
  this->fPropSets[8] = local_528;
  if ((local_252 & 1) != 0) {
    icu_63::UnicodeString::~UnicodeString(&local_248);
  }
  if ((local_251 & 1) != 0) {
    ConstChar16Ptr::~ConstChar16Ptr(&local_250);
  }
  pUVar2 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pattern);
  local_2b1 = 0;
  local_2b2 = 0;
  local_538 = (UnicodeSet *)0x0;
  if (pUVar2 != (UnicodeSet *)0x0) {
    local_261 = 1;
    local_260 = pUVar2;
    ConstChar16Ptr::ConstChar16Ptr(&local_2b0,(char16_t *)gGC_VPattern);
    local_2b1 = 1;
    icu_63::UnicodeString::UnicodeString(&local_2a8,'\x01',&local_2b0,-1);
    local_2b2 = 1;
    pattern = &local_2a8;
    UnicodeSet::UnicodeSet(pUVar2,pattern,local_18);
    local_538 = pUVar2;
  }
  local_261 = 0;
  this->fPropSets[0xb] = local_538;
  if ((local_2b2 & 1) != 0) {
    icu_63::UnicodeString::~UnicodeString(&local_2a8);
  }
  if ((local_2b1 & 1) != 0) {
    ConstChar16Ptr::~ConstChar16Ptr(&local_2b0);
  }
  pUVar2 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pattern);
  local_311 = 0;
  local_312 = 0;
  local_548 = (UnicodeSet *)0x0;
  if (pUVar2 != (UnicodeSet *)0x0) {
    local_2c1 = 1;
    local_2c0 = pUVar2;
    ConstChar16Ptr::ConstChar16Ptr(&local_310,(char16_t *)gGC_TPattern);
    local_311 = 1;
    icu_63::UnicodeString::UnicodeString(&local_308,'\x01',&local_310,-1);
    local_312 = 1;
    pattern = &local_308;
    UnicodeSet::UnicodeSet(pUVar2,pattern,local_18);
    local_548 = pUVar2;
  }
  local_2c1 = 0;
  this->fPropSets[0xc] = local_548;
  if ((local_312 & 1) != 0) {
    icu_63::UnicodeString::~UnicodeString(&local_308);
  }
  if ((local_311 & 1) != 0) {
    ConstChar16Ptr::~ConstChar16Ptr(&local_310);
  }
  pUVar2 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pattern);
  local_371 = 0;
  local_372 = 0;
  local_558 = (UnicodeSet *)0x0;
  if (pUVar2 != (UnicodeSet *)0x0) {
    local_321 = 1;
    local_320 = pUVar2;
    ConstChar16Ptr::ConstChar16Ptr(&local_370,(char16_t *)gGC_LVPattern);
    local_371 = 1;
    icu_63::UnicodeString::UnicodeString(&local_368,'\x01',&local_370,-1);
    local_372 = 1;
    pattern = &local_368;
    UnicodeSet::UnicodeSet(pUVar2,pattern,local_18);
    local_558 = pUVar2;
  }
  local_321 = 0;
  this->fPropSets[9] = local_558;
  if ((local_372 & 1) != 0) {
    icu_63::UnicodeString::~UnicodeString(&local_368);
  }
  if ((local_371 & 1) != 0) {
    ConstChar16Ptr::~ConstChar16Ptr(&local_370);
  }
  pUVar2 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pattern);
  local_3d1 = 0;
  local_3d2 = 0;
  local_568 = (UnicodeSet *)0x0;
  if (pUVar2 != (UnicodeSet *)0x0) {
    local_381 = 1;
    local_380 = pUVar2;
    ConstChar16Ptr::ConstChar16Ptr(&local_3d0,(char16_t *)gGC_LVTPattern);
    local_3d1 = 1;
    icu_63::UnicodeString::UnicodeString(&local_3c8,'\x01',&local_3d0,-1);
    local_3d2 = 1;
    pattern = &local_3c8;
    UnicodeSet::UnicodeSet(pUVar2,pattern,local_18);
    local_568 = pUVar2;
  }
  local_381 = 0;
  this->fPropSets[10] = local_568;
  if ((local_3d2 & 1) != 0) {
    icu_63::UnicodeString::~UnicodeString(&local_3c8);
  }
  if ((local_3d1 & 1) != 0) {
    ConstChar16Ptr::~ConstChar16Ptr(&local_3d0);
  }
  if ((((((this->fPropSets[1] != (UnicodeSet *)0x0) && (this->fPropSets[4] != (UnicodeSet *)0x0)) &&
        (this->fPropSets[6] != (UnicodeSet *)0x0)) &&
       ((this->fPropSets[7] != (UnicodeSet *)0x0 && (this->fPropSets[8] != (UnicodeSet *)0x0)))) &&
      ((this->fPropSets[0xb] != (UnicodeSet *)0x0 &&
       ((this->fPropSets[0xc] != (UnicodeSet *)0x0 && (this->fPropSets[9] != (UnicodeSet *)0x0))))))
     && (this->fPropSets[10] != (UnicodeSet *)0x0)) {
    UVar1 = ::U_FAILURE(*local_18);
    if (UVar1 != '\0') {
      return;
    }
    pUVar2 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pattern);
    local_3e1 = 0;
    local_580 = (UnicodeSet *)0x0;
    if (pUVar2 != (UnicodeSet *)0x0) {
      local_3e1 = 1;
      pattern = (UnicodeString *)0x0;
      local_3e0 = pUVar2;
      UnicodeSet::UnicodeSet(pUVar2,0,0x10ffff);
      local_580 = pUVar2;
    }
    this->fPropSets[5] = local_580;
    if (this->fPropSets[5] != (UnicodeSet *)0x0) {
      UnicodeSet::remove(this->fPropSets[5],(char *)0xac00);
      UnicodeSet::removeAll(this->fPropSets[5],this->fPropSets[7]);
      UnicodeSet::removeAll(this->fPropSets[5],this->fPropSets[8]);
      UnicodeSet::removeAll(this->fPropSets[5],this->fPropSets[0xb]);
      UnicodeSet::removeAll(this->fPropSets[5],this->fPropSets[0xc]);
      for (local_74 = 0; local_74 < 0xd; local_74 = local_74 + 1) {
        if (this->fPropSets[local_74] != (UnicodeSet *)0x0) {
          UnicodeSet::compact(this->fPropSets[local_74]);
          Regex8BitSet::init(this->fPropSets8 + local_74,(EVP_PKEY_CTX *)this->fPropSets[local_74]);
        }
      }
      ConstChar16Ptr::ConstChar16Ptr(&local_488,(char16_t *)gRuleSet_rule_char_pattern);
      icu_63::UnicodeString::UnicodeString(&local_480,'\x01',&local_488,-1);
      UnicodeSet::UnicodeSet(&local_440,&local_480,local_18);
      UnicodeSet::operator=((UnicodeSet *)&this->field_0x2b8,&local_440);
      UnicodeSet::~UnicodeSet(&local_440);
      icu_63::UnicodeString::~UnicodeString(&local_480);
      ConstChar16Ptr::~ConstChar16Ptr(&local_488);
      UnicodeSet::add((UnicodeSet *)&this->field_0x260,0x30,0x39);
      UnicodeSet::add((UnicodeSet *)&this->field_0x208,0x41,0x5a);
      UnicodeSet::add((UnicodeSet *)&this->field_0x208,0x61,0x7a);
      this->fRuleDigitsAlias = (UnicodeSet *)&this->field_0x260;
      for (local_74 = 0; local_74 < 10; local_74 = local_74 + 1) {
        UnicodeSet::compact((UnicodeSet *)(&this->field_0x208 + (long)local_74 * 0x58));
      }
      pattern = (UnicodeString *)0x0;
      pUVar3 = utext_openUChars_63((UText *)0x0,(UChar *)0x0,0,local_18);
      this->fEmptyText = pUVar3;
      UVar1 = ::U_SUCCESS(*local_18);
      if (UVar1 != '\0') {
        return;
      }
    }
  }
  for (local_74 = 0; local_74 < 0xd; local_74 = local_74 + 1) {
    pUVar2 = this->fPropSets[local_74];
    if (pUVar2 != (UnicodeSet *)0x0) {
      UnicodeSet::~UnicodeSet(pUVar2);
      UMemory::operator_delete((UMemory *)pUVar2,pattern);
    }
    this->fPropSets[local_74] = (UnicodeSet *)0x0;
  }
  UVar1 = ::U_SUCCESS(*local_18);
  if (UVar1 != '\0') {
    *local_18 = U_MEMORY_ALLOCATION_ERROR;
  }
  return;
}

Assistant:

RegexStaticSets::RegexStaticSets(UErrorCode *status)
:
fUnescapeCharSet(UnicodeString(TRUE, gUnescapeCharPattern, -1), *status),
fRuleDigitsAlias(NULL),
fEmptyText(NULL)
{
    // First zero out everything
    int i;
    for (i=0; i<URX_LAST_SET; i++) {
        fPropSets[i] = NULL;
    }
    // Then init the sets to their correct values.
    fPropSets[URX_ISWORD_SET]  = new UnicodeSet(UnicodeString(TRUE, gIsWordPattern, -1),     *status);
    fPropSets[URX_ISSPACE_SET] = new UnicodeSet(UnicodeString(TRUE, gIsSpacePattern, -1),    *status);
    fPropSets[URX_GC_EXTEND]   = new UnicodeSet(UnicodeString(TRUE, gGC_ExtendPattern, -1),  *status);
    fPropSets[URX_GC_CONTROL]  = new UnicodeSet(UnicodeString(TRUE, gGC_ControlPattern, -1), *status);
    fPropSets[URX_GC_L]        = new UnicodeSet(UnicodeString(TRUE, gGC_LPattern, -1),       *status);
    fPropSets[URX_GC_V]        = new UnicodeSet(UnicodeString(TRUE, gGC_VPattern, -1),       *status);
    fPropSets[URX_GC_T]        = new UnicodeSet(UnicodeString(TRUE, gGC_TPattern, -1),       *status);
    fPropSets[URX_GC_LV]       = new UnicodeSet(UnicodeString(TRUE, gGC_LVPattern, -1),      *status);
    fPropSets[URX_GC_LVT]      = new UnicodeSet(UnicodeString(TRUE, gGC_LVTPattern, -1),     *status);
    
    // Check for null pointers
    if (fPropSets[URX_ISWORD_SET] == NULL || fPropSets[URX_ISSPACE_SET] == NULL || fPropSets[URX_GC_EXTEND] == NULL || 
        fPropSets[URX_GC_CONTROL] == NULL || fPropSets[URX_GC_L] == NULL || fPropSets[URX_GC_V] == NULL || 
        fPropSets[URX_GC_T] == NULL || fPropSets[URX_GC_LV] == NULL || fPropSets[URX_GC_LVT] == NULL) {
        goto ExitConstrDeleteAll;
    }
    if (U_FAILURE(*status)) {
        // Bail out if we were unable to create the above sets.
        // The rest of the initialization needs them, so we cannot proceed.
        return;
    }


    //
    // The following sets  are dynamically constructed, because their
    //   initialization strings would be unreasonable.
    //


    //
    //  "Normal" is the set of characters that don't need special handling
    //            when finding grapheme cluster boundaries.
    //
    fPropSets[URX_GC_NORMAL] = new UnicodeSet(0, UnicodeSet::MAX_VALUE);
    // Null pointer check
    if (fPropSets[URX_GC_NORMAL] == NULL) {
    	goto ExitConstrDeleteAll;
    }
    fPropSets[URX_GC_NORMAL]->remove(0xac00, 0xd7a4);
    fPropSets[URX_GC_NORMAL]->removeAll(*fPropSets[URX_GC_CONTROL]);
    fPropSets[URX_GC_NORMAL]->removeAll(*fPropSets[URX_GC_L]);
    fPropSets[URX_GC_NORMAL]->removeAll(*fPropSets[URX_GC_V]);
    fPropSets[URX_GC_NORMAL]->removeAll(*fPropSets[URX_GC_T]);

    // Initialize the 8-bit fast bit sets from the parallel full
    //   UnicodeSets.
    for (i=0; i<URX_LAST_SET; i++) {
        if (fPropSets[i]) {
            fPropSets[i]->compact();
            fPropSets8[i].init(fPropSets[i]);
        }
    }

    // Sets used while parsing rules, but not referenced from the parse state table
    fRuleSets[kRuleSet_rule_char-128]   = UnicodeSet(UnicodeString(TRUE, gRuleSet_rule_char_pattern, -1),   *status);
    fRuleSets[kRuleSet_digit_char-128].add((UChar)0x30, (UChar)0x39);    // [0-9]
    fRuleSets[kRuleSet_ascii_letter-128].add((UChar)0x41, (UChar)0x5A);  // [A-Z]
    fRuleSets[kRuleSet_ascii_letter-128].add((UChar)0x61, (UChar)0x7A);  // [a-z]
    fRuleDigitsAlias = &fRuleSets[kRuleSet_digit_char-128];
    for (i=0; i<UPRV_LENGTHOF(fRuleSets); i++) {
        fRuleSets[i].compact();
    }
    
    // Finally, initialize an empty string for utility purposes
    fEmptyText = utext_openUChars(NULL, NULL, 0, status);
    
    if (U_SUCCESS(*status)) {
        return;
    }

ExitConstrDeleteAll: // Remove fPropSets and fRuleSets and return error
    for (i=0; i<URX_LAST_SET; i++) {
        delete fPropSets[i];
        fPropSets[i] = NULL;
    }
    if (U_SUCCESS(*status)) {
        *status = U_MEMORY_ALLOCATION_ERROR;
    }
}